

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlFinishDocument(xmlParserCtxtPtr ctxt)

{
  xmlDocPtr cur;
  int iVar1;
  xmlDocPtr doc;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->sax->endDocument != (endDocumentSAXFunc)0x0)) {
    (*ctxt->sax->endDocument)(ctxt->userData);
  }
  cur = ctxt->myDoc;
  if (cur != (xmlDocPtr)0x0) {
    if (ctxt->wellFormed != 0) {
      cur->properties = cur->properties | 1;
      if (ctxt->valid != 0) {
        cur->properties = cur->properties | 8;
      }
      if (ctxt->nsWellFormed != 0) {
        cur->properties = cur->properties | 2;
      }
    }
    if ((ctxt->options & 0x20000U) != 0) {
      cur->properties = cur->properties | 4;
    }
    iVar1 = xmlStrEqual(cur->version,(xmlChar *)"SAX compatibility mode document");
    if (iVar1 != 0) {
      xmlFreeDoc(cur);
      ctxt->myDoc = (xmlDocPtr)0x0;
    }
  }
  return;
}

Assistant:

static void
xmlFinishDocument(xmlParserCtxtPtr ctxt) {
    xmlDocPtr doc;

    /*
     * SAX: end of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
        ctxt->sax->endDocument(ctxt->userData);

    doc = ctxt->myDoc;
    if (doc != NULL) {
        if (ctxt->wellFormed) {
            doc->properties |= XML_DOC_WELLFORMED;
            if (ctxt->valid)
                doc->properties |= XML_DOC_DTDVALID;
            if (ctxt->nsWellFormed)
                doc->properties |= XML_DOC_NSVALID;
        }

        if (ctxt->options & XML_PARSE_OLD10)
            doc->properties |= XML_DOC_OLD10;

        /*
         * Remove locally kept entity definitions if the tree was not built
         */
	if (xmlStrEqual(doc->version, SAX_COMPAT_MODE)) {
            xmlFreeDoc(doc);
            ctxt->myDoc = NULL;
        }
    }
}